

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QFormLayout::takeAt(QFormLayout *this,int index)

{
  int idx;
  QFormLayoutPrivate *pQVar1;
  QFormLayoutItem **ppQVar2;
  uint in_ESI;
  QList<QFormLayoutItem_*> *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutItem *item;
  int storageIndex;
  QFormLayoutPrivate *d;
  int col;
  int row;
  ItemMatrix *in_stack_ffffffffffffff88;
  QFormLayoutItem *pQVar3;
  QMessageLogger *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  QLayoutItem *local_38;
  int local_30 [2];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QFormLayout *)0x4b6bbe);
  pQVar3 = (QFormLayoutItem *)&pQVar1->m_matrix;
  QList<QFormLayoutItem_*>::value(in_RDI,(qsizetype)in_stack_ffffffffffffff88);
  idx = storageIndexFromLayoutItem(in_stack_ffffffffffffff88,pQVar3);
  if (idx == -1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffa0,(char *)pQVar3,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff88);
    QMessageLogger::warning(local_28,"QFormLayout::takeAt: Invalid index %d",(ulong)in_ESI);
    local_38 = (QLayoutItem *)0x0;
  }
  else {
    local_30[1] = 0xaaaaaaaa;
    local_30[0] = -0x55555556;
    QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::storageIndexToPosition
              (idx,local_30 + 1,local_30);
    ppQVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                        ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)in_RDI,
                         (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                         (int)in_stack_ffffffffffffff88);
    pQVar3 = *ppQVar2;
    QList<QFormLayoutItem_*>::removeAt(in_RDI,(qsizetype)in_stack_ffffffffffffff88);
    ppQVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                        ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)in_RDI,
                         (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                         (int)in_stack_ffffffffffffff88);
    *ppQVar2 = (QFormLayoutItem *)0x0;
    (**(code **)&(in_RDI->d).d[7].super_QArrayData)();
    local_38 = ownershipCleanedItem
                         ((QFormLayoutItem *)CONCAT44(idx,in_stack_ffffffffffffffa8),
                          (QFormLayout *)pQVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QFormLayout::takeAt(int index)
{
    Q_D(QFormLayout);

    const int storageIndex = storageIndexFromLayoutItem(d->m_matrix, d->m_things.value(index));
    if (Q_UNLIKELY(storageIndex == -1)) {
        qWarning("QFormLayout::takeAt: Invalid index %d", index);
        return nullptr;
    }

    int row, col;
    QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);
    Q_ASSERT(d->m_matrix(row, col));

    QFormLayoutItem *item = d->m_matrix(row, col);
    Q_ASSERT(item);
    d->m_things.removeAt(index);
    d->m_matrix(row, col) = 0;

    invalidate();

    return ownershipCleanedItem(item, this);
}